

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

void __thiscall
QWidgetTextControlPrivate::showToolTip
          (QWidgetTextControlPrivate *this,QPoint *globalPos,QPointF *pos,QWidget *contextWidget)

{
  long in_FS_OFFSET;
  QWidgetTextControl local_70 [8];
  QString local_68;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::cursorForPosition(local_70,*(QPointF **)&this->field_0x8);
  QTextCursor::charFormat();
  QTextFormat::stringProperty((int)&local_68);
  QTextFormat::~QTextFormat((QTextFormat *)&local_48);
  QTextCursor::~QTextCursor((QTextCursor *)local_70);
  if ((undefined1 *)local_68.d.size != (undefined1 *)0x0) {
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
    local_48.x2.m_i = -1;
    local_48.y2.m_i = -1;
    QToolTip::showText(globalPos,&local_68,contextWidget,&local_48,-1);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::showToolTip(const QPoint &globalPos, const QPointF &pos, QWidget *contextWidget)
{
    const QString toolTip = q_func()->cursorForPosition(pos).charFormat().toolTip();
    if (toolTip.isEmpty())
        return;
    QToolTip::showText(globalPos, toolTip, contextWidget);
}